

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall ArrayOps::evaluate(ArrayOps *this,SymTab *symTab)

{
  bool bVar1;
  int iVar2;
  TypeDescriptor *pTVar3;
  undefined4 extraout_var;
  types *ptVar4;
  NumberDescriptor *this_00;
  undefined4 extraout_var_00;
  StringDescriptor *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ArrayDescriptor *this_02;
  double dVar5;
  Token local_210;
  string local_1a0;
  undefined1 local_179;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_178;
  ArrayDescriptor *local_160;
  TypeDescriptor *updatedArray;
  __normal_iterator<TypeDescriptor_**,_std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>_>
  local_150;
  __normal_iterator<TypeDescriptor_**,_std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>_>
  local_148;
  __normal_iterator<TypeDescriptor_**,_std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>_>
  local_140;
  const_iterator local_138;
  int local_130;
  undefined1 local_129;
  int index;
  StringDescriptor *local_108;
  TypeDescriptor *newElement_1;
  TypeDescriptor *newElement;
  undefined1 local_d8 [8];
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  Token local_b0;
  string local_40;
  TypeDescriptor *local_20;
  TypeDescriptor *value;
  SymTab *symTab_local;
  ArrayOps *this_local;
  
  value = (TypeDescriptor *)symTab;
  symTab_local = (SymTab *)this;
  ExprNode::token(&local_b0,this->_id);
  Token::getName_abi_cxx11_(&local_40,&local_b0);
  pTVar3 = SymTab::getValueFor(symTab,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Token::~Token(&local_b0);
  local_20 = pTVar3;
  TypeDescriptor::getArray
            ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8,pTVar3);
  Token::getName_abi_cxx11_((string *)&newElement,&this->_op);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &newElement,"append");
  std::__cxx11::string::~string((string *)&newElement);
  if (bVar1) {
    iVar2 = (*this->_test->_vptr_ExprNode[1])(this->_test,value);
    ptVar4 = TypeDescriptor::type((TypeDescriptor *)CONCAT44(extraout_var,iVar2));
    if (*ptVar4 == NUMBER) {
      this_00 = (NumberDescriptor *)operator_new(0x60);
      iVar2 = (*this->_test->_vptr_ExprNode[1])(this->_test,value);
      dVar5 = TypeDescriptor::getNumber((TypeDescriptor *)CONCAT44(extraout_var_00,iVar2));
      NumberDescriptor::NumberDescriptor(this_00,dVar5);
      newElement_1 = (TypeDescriptor *)this_00;
      std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::push_back
                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8,
                 &newElement_1);
    }
    else {
      this_01 = (StringDescriptor *)operator_new(0x78);
      local_129 = 1;
      iVar2 = (*this->_test->_vptr_ExprNode[1])(this->_test,value);
      TypeDescriptor::getString_abi_cxx11_
                ((string *)&index,(TypeDescriptor *)CONCAT44(extraout_var_01,iVar2));
      StringDescriptor::StringDescriptor(this_01,(string *)&index);
      local_129 = 0;
      std::__cxx11::string::~string((string *)&index);
      local_108 = this_01;
      std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::push_back
                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8,
                 (value_type *)&local_108);
    }
  }
  else if (this->_test == (ExprNode *)0x0) {
    std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::pop_back
              ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8);
  }
  else {
    iVar2 = (*this->_test->_vptr_ExprNode[1])(this->_test,value);
    dVar5 = TypeDescriptor::getNumber((TypeDescriptor *)CONCAT44(extraout_var_02,iVar2));
    local_130 = (int)dVar5;
    local_150._M_current =
         (TypeDescriptor **)
         std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::begin
                   ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8);
    local_148 = __gnu_cxx::
                __normal_iterator<TypeDescriptor_**,_std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>_>
                ::operator+(&local_150,(long)local_130);
    local_140 = __gnu_cxx::
                __normal_iterator<TypeDescriptor_**,_std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>_>
                ::operator-(&local_148,1);
    __gnu_cxx::
    __normal_iterator<TypeDescriptor*const*,std::vector<TypeDescriptor*,std::allocator<TypeDescriptor*>>>
    ::__normal_iterator<TypeDescriptor**>
              ((__normal_iterator<TypeDescriptor*const*,std::vector<TypeDescriptor*,std::allocator<TypeDescriptor*>>>
                *)&local_138,&local_140);
    updatedArray = (TypeDescriptor *)
                   std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::erase
                             ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)
                              local_d8,local_138);
  }
  this_02 = (ArrayDescriptor *)operator_new(0x70);
  local_179 = 1;
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
            (&local_178,(vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8);
  ArrayDescriptor::ArrayDescriptor(this_02,&local_178);
  local_179 = 0;
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~vector(&local_178);
  pTVar3 = value;
  local_160 = this_02;
  ExprNode::token(&local_210,this->_id);
  Token::getName_abi_cxx11_(&local_1a0,&local_210);
  SymTab::setValueFor((SymTab *)pTVar3,&local_1a0,&local_160->super_TypeDescriptor);
  std::__cxx11::string::~string((string *)&local_1a0);
  Token::~Token(&local_210);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~vector
            ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_d8);
  return;
}

Assistant:

void ArrayOps::evaluate(SymTab &symTab) {
    TypeDescriptor *value = symTab.getValueFor(_id->token().getName());
    std::vector<TypeDescriptor*>array = value->getArray();
    if(_op.getName() == "append"){
        if(_test->evaluate(symTab)->type() == TypeDescriptor::NUMBER){
            TypeDescriptor *newElement = new NumberDescriptor(_test->evaluate(symTab)->getNumber());
            array.push_back(newElement);
        }else{
            TypeDescriptor *newElement = new StringDescriptor(_test->evaluate(symTab)->getString());
            array.push_back(newElement);
        }

    }else{ // pop
        if(_test== nullptr) { //pop Last
            array.pop_back();
        }else{
            int index = _test->evaluate(symTab)->getNumber();
            array.erase(array.begin()+ index -1);
        }
    }
    TypeDescriptor *updatedArray = new ArrayDescriptor(array);
    symTab.setValueFor(_id->token().getName(),updatedArray);

}